

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashUtils.hpp
# Opt level: O0

void __thiscall
Diligent::HashMapStringKey::HashMapStringKey(HashMapStringKey *this,Char *_Str,bool bMakeCopy)

{
  Char *pCVar1;
  size_t sVar2;
  size_t sVar3;
  char *StrCopy;
  size_t LenWithZeroTerm;
  undefined1 local_40 [8];
  string msg;
  bool bMakeCopy_local;
  Char *_Str_local;
  HashMapStringKey *this_local;
  
  this->Str = _Str;
  this->Ownership_Hash = 0;
  msg.field_2._M_local_buf[0xf] = bMakeCopy;
  if (this->Str == (Char *)0x0) {
    FormatString<char[32]>((string *)local_40,(char (*) [32])"String pointer must not be null");
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar1,"HashMapStringKey",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/HashUtils.hpp"
               ,0xec);
    std::__cxx11::string::~string((string *)local_40);
  }
  sVar2 = CStringHash<char>::operator()((CStringHash<char> *)((long)&LenWithZeroTerm + 3),this->Str)
  ;
  this->Ownership_Hash = sVar2 & 0x7fffffffffffffff;
  if ((msg.field_2._M_local_buf[0xf] & 1U) != 0) {
    sVar3 = strlen(this->Str);
    pCVar1 = (Char *)operator_new__(sVar3 + 1);
    memcpy(pCVar1,this->Str,sVar3 + 1);
    this->Str = pCVar1;
    this->Ownership_Hash = this->Ownership_Hash | 0x8000000000000000;
  }
  return;
}

Assistant:

HashMapStringKey(const Char* _Str, bool bMakeCopy = false) :
        Str{_Str}
    {
        VERIFY(Str, "String pointer must not be null");

        Ownership_Hash = CStringHash<Char>{}.operator()(Str) & HashMask;
        if (bMakeCopy)
        {
            auto  LenWithZeroTerm = strlen(Str) + 1;
            auto* StrCopy         = new char[LenWithZeroTerm];
            std::memcpy(StrCopy, Str, LenWithZeroTerm);
            Str = StrCopy;
            Ownership_Hash |= StrOwnershipMask;
        }
    }